

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void moveToFreeBindingList(XML_Parser parser,BINDING *bindings)

{
  binding *pbVar1;
  BINDING *b;
  BINDING *bindings_local;
  XML_Parser parser_local;
  
  b = bindings;
  while (b != (BINDING *)0x0) {
    pbVar1 = b->nextTagBinding;
    b->nextTagBinding = parser->m_freeBindingList;
    parser->m_freeBindingList = b;
    b = pbVar1;
  }
  return;
}

Assistant:

static void FASTCALL
moveToFreeBindingList(XML_Parser parser, BINDING *bindings)
{
  while (bindings) {
    BINDING *b = bindings;
    bindings = bindings->nextTagBinding;
    b->nextTagBinding = freeBindingList;
    freeBindingList = b;
  }
}